

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O2

void __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::MarkAlgConDeleted
          (BasicProblem<mp::BasicProblemParams<int>_> *this,int con_index)

{
  reference rVar1;
  
  if ((ulong)(this->is_alg_con_deleted_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
      ((long)(this->is_alg_con_deleted_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
      (long)(this->is_alg_con_deleted_).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 <=
      (ulong)(long)con_index) {
    std::vector<bool,_std::allocator<bool>_>::resize
              (&this->is_alg_con_deleted_,
               (long)(int)(((long)(this->algebraic_cons_).
                                  super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->algebraic_cons_).
                                 super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x88),false);
  }
  rVar1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    (&this->is_alg_con_deleted_,(long)con_index);
  *rVar1._M_p = *rVar1._M_p | rVar1._M_mask;
  return;
}

Assistant:

void MarkAlgConDeleted(int con_index) {
    internal::CheckIndex(con_index, algebraic_cons_.size());
    if (is_alg_con_deleted_.size() <= static_cast<std::size_t>(con_index))
      is_alg_con_deleted_.resize(num_algebraic_cons());
    is_alg_con_deleted_[con_index] = true;
  }